

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O3

int xmlC14NDocDumpMemory
              (xmlDocPtr doc,xmlNodeSetPtr nodes,int mode,xmlChar **inclusive_ns_prefixes,
              int with_comments,xmlChar **doc_txt_ptr)

{
  int iVar1;
  xmlOutputBufferPtr buf;
  size_t sVar2;
  xmlChar *pxVar3;
  
  if (doc_txt_ptr == (xmlChar **)0x0) {
    xmlC14NErrFull((xmlC14NCtxPtr)0x0,(xmlNodePtr)0x0,0x73,(char *)0x0,"Invalid argument\n",0);
  }
  else {
    *doc_txt_ptr = (xmlChar *)0x0;
    buf = xmlAllocOutputBuffer((xmlCharEncodingHandlerPtr)0x0);
    if (buf != (xmlOutputBufferPtr)0x0) {
      iVar1 = xmlC14NExecute(doc,xmlC14NIsNodeInNodeset,nodes,mode,inclusive_ns_prefixes,
                             with_comments,buf);
      if (iVar1 < 0) {
        xmlOutputBufferClose(buf);
        return -1;
      }
      sVar2 = xmlBufUse(buf->buffer);
      iVar1 = (int)sVar2;
      if (-1 < iVar1) {
        pxVar3 = xmlBufContent(buf->buffer);
        pxVar3 = xmlStrndup(pxVar3,iVar1);
        *doc_txt_ptr = pxVar3;
      }
      xmlOutputBufferClose(buf);
      if (iVar1 < 0) {
        return iVar1;
      }
      if (*doc_txt_ptr != (xmlChar *)0x0) {
        return iVar1;
      }
    }
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x15,
                        (xmlError *)0x0);
  }
  return -1;
}

Assistant:

int
xmlC14NDocDumpMemory(xmlDocPtr doc, xmlNodeSetPtr nodes,
                     int mode, xmlChar ** inclusive_ns_prefixes,
                     int with_comments, xmlChar ** doc_txt_ptr)
{
    int ret;
    xmlOutputBufferPtr buf;

    if (doc_txt_ptr == NULL) {
        xmlC14NErrParam(NULL);
        return (-1);
    }

    *doc_txt_ptr = NULL;

    /*
     * create memory buffer with UTF8 (default) encoding
     */
    buf = xmlAllocOutputBuffer(NULL);
    if (buf == NULL) {
        xmlC14NErrMemory(NULL);
        return (-1);
    }

    /*
     * canonize document and write to buffer
     */
    ret = xmlC14NDocSaveTo(doc, nodes, mode, inclusive_ns_prefixes,
                           with_comments, buf);
    if (ret < 0) {
        (void) xmlOutputBufferClose(buf);
        return (-1);
    }

    ret = xmlBufUse(buf->buffer);
    if (ret >= 0) {
        *doc_txt_ptr = xmlStrndup(xmlBufContent(buf->buffer), ret);
    }
    (void) xmlOutputBufferClose(buf);

    if ((*doc_txt_ptr == NULL) && (ret >= 0)) {
        xmlC14NErrMemory(NULL);
        return (-1);
    }
    return (ret);
}